

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O0

void __thiscall OpenMD::TimeCorrFunc<int>::correlation(TimeCorrFunc<int> *this)

{
  double dVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  pointer this_00;
  undefined8 uVar8;
  long *in_RDI;
  bool bVar9;
  int timeBin;
  RealType time2;
  int j;
  RealType time1;
  int i_1;
  int visited;
  RealType samples;
  uint i;
  int zeroType;
  undefined4 in_stack_ffffffffffffffb0;
  value_type in_stack_ffffffffffffffb4;
  uint local_2c;
  uint local_20;
  int local_1c;
  uint local_10;
  value_type local_c;
  
  local_c = 0;
  for (local_10 = 0; local_10 < *(uint *)(in_RDI + 7); local_10 = local_10 + 1) {
    in_stack_ffffffffffffffb4 = local_c;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(ulong)local_10);
    *pvVar6 = in_stack_ffffffffffffffb4;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb),(ulong)local_10);
    *pvVar6 = 0;
  }
  std::unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::operator->
            ((unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_> *)0x192e6b)
  ;
  ProgressBar::clear((ProgressBar *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  iVar4 = *(int *)((long)in_RDI + 0x3c);
  iVar5 = *(int *)((long)in_RDI + 0x3c);
  local_1c = 0;
  for (local_20 = 0; (int)local_20 < *(int *)((long)in_RDI + 0x3c); local_20 = local_20 + 1) {
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),
                        (long)(int)local_20);
    dVar1 = *pvVar7;
    for (local_2c = local_20; (int)local_2c < *(int *)((long)in_RDI + 0x3c); local_2c = local_2c + 1
        ) {
      local_1c = local_1c + 1;
      this_00 = std::unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::
                operator->((unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>
                            *)0x192f12);
      ProgressBar::setStatus(this_00,(double)local_1c,(double)(iVar4 + 1) * 0.5 * (double)iVar5);
      std::unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::operator->
                ((unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_> *)
                 0x192f37);
      ProgressBar::update((ProgressBar *)time2);
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),
                          (long)(int)local_2c);
      dVar2 = *pvVar7;
      if ((double)in_RDI[0x12] * 6.0 * (double)(int)(local_2c - local_20) <
          ABS(-(double)(int)(local_2c - local_20) * (double)in_RDI[0x11] + (dVar2 - dVar1))) {
        lVar3 = in_RDI[0x11];
        uVar8 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "TimeCorrFunc::correlateBlocks: mean sampleTime (%f)\n\tin %s does not match actual time-spacing between\n\tconfigurations %d (t = %f) and %d (t = %f).\n"
                 ,lVar3,SUB84(dVar1,0),dVar2,uVar8,(ulong)local_20,(ulong)local_2c);
        bVar9 = (*(byte *)((long)in_RDI + 0xd47) & 1) == 0;
        if (bVar9) {
          painCave.severity = 1;
        }
        else {
          painCave.severity = 3;
        }
        painCave.isFatal = (int)bVar9;
        simError();
      }
      (**(code **)(*in_RDI + 0x40))
                (in_RDI,local_20,local_2c,(int)((dVar2 - dVar1) / (double)in_RDI[0x11] + 0.5));
    }
  }
  return;
}

Assistant:

void TimeCorrFunc<T>::correlation() {
    T zeroType(0.0);
    for (unsigned int i = 0; i < nTimeBins_; ++i) {
      histogram_[i] = zeroType;
      count_[i]     = 0;
    }

    progressBar_->clear();
    RealType samples = 0.5 * (nFrames_ + 1) * nFrames_;
    int visited      = 0;

    for (int i = 0; i < nFrames_; ++i) {
      RealType time1 = times_[i];

      for (int j = i; j < nFrames_; ++j) {
        visited++;
        progressBar_->setStatus(visited, samples);
        progressBar_->update();

        // Perform a sanity check on the actual configuration times to
        // make sure the configurations are spaced the same amount the
        // sample time said they were spaced:

        RealType time2 = times_[j];

        if (std::fabs((time2 - time1) - (j - i) * dtMean_) >
            6 * dtSigma_ * (j - i)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "TimeCorrFunc::correlateBlocks: mean sampleTime (%f)\n"
                   "\tin %s does not match actual time-spacing between\n"
                   "\tconfigurations %d (t = %f) and %d (t = %f).\n",
                   dtMean_, dumpFilename_.c_str(), i, time1, j, time2);
          if (allowTimeFuzz_) {
            painCave.isFatal  = 0;
            painCave.severity = OPENMD_INFO;
          } else {
            painCave.isFatal  = 1;
            painCave.severity = OPENMD_ERROR;
          }
          simError();
        }

        int timeBin = int((time2 - time1) / dtMean_ + 0.5);
        correlateFrames(i, j, timeBin);
      }
    }
  }